

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

void __thiscall CNet::CNet(CNet *this)

{
  CNet *this_local;
  
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CNet_001cdbe8;
  std::vector<CWire_*,_std::allocator<CWire_*>_>::vector(&this->m_Wire);
  CBBox::CBBox(&this->m_BBox);
  this->m_iNumPin = 0;
  this->m_ppPin = (CPin **)0x0;
  this->m_iMinWL = 0x7f7f7f7f;
  return;
}

Assistant:

CNet::CNet()
{
	//m_cWidth	=	1;
	m_iNumPin	=	0;
	m_ppPin		=	NULL;
	m_iMinWL	=	MAX_NUMBER;
//	m_iMinVia	=	0;
}